

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_stream.hpp
# Opt level: O2

string * __thiscall
iutest::detail::IInStream::ReadAll_abi_cxx11_(string *__return_storage_ptr__,IInStream *this)

{
  int iVar1;
  undefined4 extraout_var;
  void *pvVar3;
  long lVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = (*this->_vptr_IInStream[3])(this);
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 != 0) {
    pvVar3 = operator_new__(lVar2 + 1);
    *(undefined1 *)((long)pvVar3 + lVar2) = 0;
    iVar1 = (*this->_vptr_IInStream[2])(this,pvVar3,lVar2,1);
    if ((char)iVar1 != '\0') {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
    operator_delete__(pvVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual ::std::string ReadAll()
    {
        ::std::string str;
        const size_t size = static_cast<size_t>(GetSize());
        if( size != 0 )
        {
            char* buf = new char[size+1];
            buf[size] = '\0';
            if( Read(buf, size, 1) )
            {
                str = buf;
            }
            delete [] buf;
        }
        return str;
    }